

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonvalue.cpp
# Opt level: O3

QString * __thiscall
QJsonValueConstRef::objectKey
          (QString *__return_storage_ptr__,QJsonValueConstRef *this,QJsonValueConstRef self)

{
  QCborContainerPrivate::stringAt
            (__return_storage_ptr__,(QCborContainerPrivate *)(this->field_0).a,
             ((ulong)self.field_0.a >> (~self.field_0._0_1_ & 1)) - 1);
  return __return_storage_ptr__;
}

Assistant:

QString QJsonValueConstRef::objectKey(QJsonValueConstRef self)
{
    Q_ASSERT(self.is_object);
    const QCborContainerPrivate *d = QJsonPrivate::Value::container(self);
    qsizetype index = QJsonPrivate::Value::indexHelper(self);

    Q_ASSERT(d);
    Q_ASSERT(index < d->elements.size());
    return d->stringAt(index - 1);
}